

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

void Gia_ManCleanTruth(Gia_Man_t *p)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  Gia_Man_t *p_local;
  
  if (p->vTruths == (Vec_Int_t *)0x0) {
    iVar1 = Gia_ManObjNum(p);
    pVVar2 = Vec_IntAlloc(iVar1);
    p->vTruths = pVVar2;
  }
  pVVar2 = p->vTruths;
  iVar1 = Gia_ManObjNum(p);
  Vec_IntFill(pVVar2,iVar1,-1);
  return;
}

Assistant:

void Gia_ManCleanTruth( Gia_Man_t * p )
{
    if ( p->vTruths == NULL )
        p->vTruths = Vec_IntAlloc( Gia_ManObjNum(p) );
    Vec_IntFill( p->vTruths, Gia_ManObjNum(p), -1 );
}